

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O2

void __thiscall
gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
::emplacePriority<helics::ActionMessage>
          (BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this,
          ActionMessage *args)

{
  bool bVar1;
  bool expEmpty;
  unique_lock<std::mutex> pullLock;
  
  expEmpty = true;
  bVar1 = std::atomic<bool>::compare_exchange_strong
                    ((atomic<bool> *)&this->queueEmptyFlag,&expEmpty,false,seq_cst);
  if (bVar1) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&pullLock,(mutex_type *)&this->m_pullLock);
    LOCK();
    (this->queueEmptyFlag)._M_base._M_i = false;
    UNLOCK();
    CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
    emplace_back<helics::ActionMessage>(&(this->priorityQueue).c,args);
  }
  else {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&pullLock,(mutex_type *)&this->m_pullLock);
    CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
    emplace_back<helics::ActionMessage>(&(this->priorityQueue).c,args);
    expEmpty = true;
    bVar1 = std::atomic<bool>::compare_exchange_strong
                      ((atomic<bool> *)&this->queueEmptyFlag,&expEmpty,false,seq_cst);
    if (!bVar1) goto LAB_0024c772;
  }
  std::condition_variable::notify_all();
LAB_0024c772:
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&pullLock);
  return;
}

Assistant:

void emplacePriority(Args&&... args)
        {
            bool expEmpty = true;
            if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                std::unique_lock<MUTEX> pullLock(m_pullLock);  // first pullLock
                queueEmptyFlag = false;  // need to set the flag again just in
                                         // case after we get the lock
                priorityQueue.emplace(std::forward<Args>(args)...);
                // pullLock.unlock ();
                condition.notify_all();
            } else {
                std::unique_lock<MUTEX> pullLock(m_pullLock);
                priorityQueue.emplace(std::forward<Args>(args)...);
                expEmpty = true;
                if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                    condition.notify_all();
                }
            }
        }